

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_work_stealing.cpp
# Opt level: O2

void skewed_starvation(size_t W)

{
  Node *pNVar1;
  Task *tasks;
  FlowBuilder FVar2;
  uint uVar3;
  pointer pcVar4;
  long *plVar5;
  ulong *puVar6;
  Task *tasks_1;
  Executor *this;
  ulong __val;
  allocator<char> local_341;
  Task left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_338;
  Task parent;
  Task right;
  atomic<unsigned_long> count;
  atomic<unsigned_long> stop;
  size_t W_local;
  shared_ptr<tf::WorkerInterface> local_2e8;
  string local_2d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> set;
  mutex mutex;
  Taskflow taskflow;
  Executor executor;
  
  W_local = W;
  tf::Taskflow::Taskflow(&taskflow);
  local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  tf::Executor::Executor(&executor,W,&local_2e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_2e8.super___shared_ptr<tf::WorkerInterface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  FVar2 = taskflow.super_FlowBuilder;
  mutex.super___mutex_base._M_mutex._16_8_ = 0;
  mutex.super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  mutex.super___mutex_base._M_mutex.__align = 0;
  mutex.super___mutex_base._M_mutex._8_8_ = 0;
  set._M_h._M_buckets = &set._M_h._M_single_bucket;
  set._M_h._M_bucket_count = 1;
  set._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  set._M_h._M_element_count = 0;
  set._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  set._M_h._M_rehash_policy._M_next_resize = 0;
  set._M_h._M_single_bucket = (__node_base_ptr)0x0;
  pcVar4 = (pointer)operator_new(0xd8);
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  *(pointer *)(pcVar4 + 8) = pcVar4 + 0x18;
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0x18] = '\0';
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  pcVar4[0x30] = '\0';
  pcVar4[0x31] = '\0';
  pcVar4[0x32] = '\0';
  pcVar4[0x33] = '\0';
  pcVar4[0x34] = '\0';
  pcVar4[0x35] = '\0';
  pcVar4[0x36] = '\0';
  pcVar4[0x37] = '\0';
  pcVar4[0x38] = '\0';
  pcVar4[0x39] = '\0';
  pcVar4[0x3a] = '\0';
  pcVar4[0x3b] = '\0';
  pcVar4[0x3c] = '\0';
  pcVar4[0x3d] = '\0';
  pcVar4[0x3e] = '\0';
  pcVar4[0x3f] = '\0';
  pcVar4[0x40] = '\0';
  pcVar4[0x41] = '\0';
  pcVar4[0x42] = '\0';
  pcVar4[0x43] = '\0';
  pcVar4[0x44] = '\0';
  pcVar4[0x45] = '\0';
  pcVar4[0x46] = '\0';
  pcVar4[0x47] = '\0';
  *(pointer *)(pcVar4 + 0x48) = pcVar4 + 0x60;
  *(pointer *)(pcVar4 + 0x50) = pcVar4 + 0x60;
  *(pointer *)(pcVar4 + 0x58) = pcVar4 + 0x80;
  pcVar4[0x80] = '\0';
  pcVar4[0x81] = '\0';
  pcVar4[0x82] = '\0';
  pcVar4[0x83] = '\0';
  pcVar4[0x84] = '\0';
  pcVar4[0x85] = '\0';
  pcVar4[0x86] = '\0';
  pcVar4[0x87] = '\0';
  pcVar4[0x88] = '\0';
  pcVar4[0x89] = '\0';
  pcVar4[0x8a] = '\0';
  pcVar4[0x8b] = '\0';
  pcVar4[0x8c] = '\0';
  pcVar4[0x8d] = '\0';
  pcVar4[0x8e] = '\0';
  pcVar4[0x8f] = '\0';
  pcVar4[0x90] = '\0';
  pcVar4[0x91] = '\0';
  pcVar4[0x92] = '\0';
  pcVar4[0x93] = '\0';
  pcVar4[0x94] = '\0';
  pcVar4[0x95] = '\0';
  pcVar4[0x96] = '\0';
  pcVar4[0x97] = '\0';
  pcVar4[0x98] = '\0';
  pcVar4[0x99] = '\0';
  pcVar4[0x9a] = '\0';
  pcVar4[0x9b] = '\0';
  pcVar4[0x9c] = '\0';
  pcVar4[0x9d] = '\0';
  pcVar4[0x9e] = '\0';
  pcVar4[0x9f] = '\0';
  pcVar4[0xa0] = '\0';
  pcVar4[0xa1] = '\0';
  pcVar4[0xa2] = '\0';
  pcVar4[0xa3] = '\0';
  pcVar4[0xa4] = '\0';
  pcVar4[0xa5] = '\0';
  pcVar4[0xa6] = '\0';
  pcVar4[0xa7] = '\0';
  plVar5 = (long *)operator_new(0x18);
  *plVar5 = (long)&set;
  plVar5[1] = (long)&count;
  plVar5[2] = (long)&stop;
  *(long **)(pcVar4 + 0x88) = plVar5;
  *(code **)(pcVar4 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:513:38)>
       ::_M_invoke;
  *(code **)(pcVar4 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:513:38)>
       ::_M_manager;
  pcVar4[0xc0] = '\x01';
  pcVar4[200] = '\0';
  pcVar4[0xc9] = '\0';
  pcVar4[0xca] = '\0';
  pcVar4[0xcb] = '\0';
  pcVar4[0xcc] = '\0';
  pcVar4[0xcd] = '\0';
  pcVar4[0xce] = '\0';
  pcVar4[0xcf] = '\0';
  pcVar4[0xd0] = '\0';
  pcVar4[0xd1] = '\0';
  pcVar4[0xd2] = '\0';
  pcVar4[0xd3] = '\0';
  pcVar4[0xd4] = '\0';
  pcVar4[0xd5] = '\0';
  pcVar4[0xd6] = '\0';
  pcVar4[0xd7] = '\0';
  local_338._M_dataplus._M_p = pcVar4;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
  pNVar1 = ((FVar2._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"root",(allocator<char> *)&local_2b0);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  parent._node = pNVar1;
  std::__cxx11::string::~string((string *)&local_338);
  left._node = (Node *)0x0;
  right._node = (Node *)0x0;
  for (__val = 0; FVar2._graph = taskflow.super_FlowBuilder._graph, __val < W; __val = __val + 1) {
    pcVar4 = (pointer)operator_new(0xd8);
    pcVar4[0] = '\0';
    pcVar4[1] = '\0';
    pcVar4[2] = '\0';
    pcVar4[3] = '\0';
    pcVar4[4] = '\0';
    pcVar4[5] = '\0';
    pcVar4[6] = '\0';
    pcVar4[7] = '\0';
    *(pointer *)(pcVar4 + 8) = pcVar4 + 0x18;
    pcVar4[0x10] = '\0';
    pcVar4[0x11] = '\0';
    pcVar4[0x12] = '\0';
    pcVar4[0x13] = '\0';
    pcVar4[0x14] = '\0';
    pcVar4[0x15] = '\0';
    pcVar4[0x16] = '\0';
    pcVar4[0x17] = '\0';
    pcVar4[0x18] = '\0';
    pcVar4[0x28] = '\0';
    pcVar4[0x29] = '\0';
    pcVar4[0x2a] = '\0';
    pcVar4[0x2b] = '\0';
    pcVar4[0x2c] = '\0';
    pcVar4[0x2d] = '\0';
    pcVar4[0x2e] = '\0';
    pcVar4[0x2f] = '\0';
    pcVar4[0x30] = '\0';
    pcVar4[0x31] = '\0';
    pcVar4[0x32] = '\0';
    pcVar4[0x33] = '\0';
    pcVar4[0x34] = '\0';
    pcVar4[0x35] = '\0';
    pcVar4[0x36] = '\0';
    pcVar4[0x37] = '\0';
    pcVar4[0x38] = '\0';
    pcVar4[0x39] = '\0';
    pcVar4[0x3a] = '\0';
    pcVar4[0x3b] = '\0';
    pcVar4[0x3c] = '\0';
    pcVar4[0x3d] = '\0';
    pcVar4[0x3e] = '\0';
    pcVar4[0x3f] = '\0';
    pcVar4[0x40] = '\0';
    pcVar4[0x41] = '\0';
    pcVar4[0x42] = '\0';
    pcVar4[0x43] = '\0';
    pcVar4[0x44] = '\0';
    pcVar4[0x45] = '\0';
    pcVar4[0x46] = '\0';
    pcVar4[0x47] = '\0';
    *(pointer *)(pcVar4 + 0x48) = pcVar4 + 0x60;
    *(pointer *)(pcVar4 + 0x50) = pcVar4 + 0x60;
    *(pointer *)(pcVar4 + 0x58) = pcVar4 + 0x80;
    pcVar4[0x80] = '\0';
    pcVar4[0x81] = '\0';
    pcVar4[0x82] = '\0';
    pcVar4[0x83] = '\0';
    pcVar4[0x84] = '\0';
    pcVar4[0x85] = '\0';
    pcVar4[0x86] = '\0';
    pcVar4[0x87] = '\0';
    pcVar4[0x88] = '\0';
    pcVar4[0x89] = '\0';
    pcVar4[0x8a] = '\0';
    pcVar4[0x8b] = '\0';
    pcVar4[0x8c] = '\0';
    pcVar4[0x8d] = '\0';
    pcVar4[0x8e] = '\0';
    pcVar4[0x8f] = '\0';
    pcVar4[0x90] = '\0';
    pcVar4[0x91] = '\0';
    pcVar4[0x92] = '\0';
    pcVar4[0x93] = '\0';
    pcVar4[0x94] = '\0';
    pcVar4[0x95] = '\0';
    pcVar4[0x96] = '\0';
    pcVar4[0x97] = '\0';
    pcVar4[0x98] = '\0';
    pcVar4[0x99] = '\0';
    pcVar4[0x9a] = '\0';
    pcVar4[0x9b] = '\0';
    pcVar4[0x9c] = '\0';
    pcVar4[0x9d] = '\0';
    pcVar4[0x9e] = '\0';
    pcVar4[0x9f] = '\0';
    pcVar4[0xa0] = '\0';
    pcVar4[0xa1] = '\0';
    pcVar4[0xa2] = '\0';
    pcVar4[0xa3] = '\0';
    pcVar4[0xa4] = '\0';
    pcVar4[0xa5] = '\0';
    pcVar4[0xa6] = '\0';
    pcVar4[0xa7] = '\0';
    puVar6 = (ulong *)operator_new(0x30);
    *puVar6 = __val;
    puVar6[1] = (ulong)&mutex;
    puVar6[2] = (ulong)&set;
    puVar6[3] = (ulong)&executor;
    puVar6[4] = (ulong)&count;
    puVar6[5] = (ulong)&stop;
    *(ulong **)(pcVar4 + 0x88) = puVar6;
    *(code **)(pcVar4 + 0xa0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:522:30)>
         ::_M_invoke;
    *(code **)(pcVar4 + 0x98) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:522:30)>
         ::_M_manager;
    pcVar4[0xc0] = '\x01';
    pcVar4[200] = '\0';
    pcVar4[0xc9] = '\0';
    pcVar4[0xca] = '\0';
    pcVar4[0xcb] = '\0';
    pcVar4[0xcc] = '\0';
    pcVar4[0xcd] = '\0';
    pcVar4[0xce] = '\0';
    pcVar4[0xcf] = '\0';
    pcVar4[0xd0] = '\0';
    pcVar4[0xd1] = '\0';
    pcVar4[0xd2] = '\0';
    pcVar4[0xd3] = '\0';
    pcVar4[0xd4] = '\0';
    pcVar4[0xd5] = '\0';
    pcVar4[0xd6] = '\0';
    pcVar4[0xd7] = '\0';
    local_338._M_dataplus._M_p = pcVar4;
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"right-",&local_341);
    std::__cxx11::to_string(&local_2d0,__val);
    std::operator+(&local_338,&local_2b0,&local_2d0);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    right._node = pNVar1;
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    FVar2 = taskflow.super_FlowBuilder;
    local_338._M_dataplus._M_p = (pointer)operator_new(0xd8);
    local_338._M_dataplus._M_p[0] = '\0';
    local_338._M_dataplus._M_p[1] = '\0';
    local_338._M_dataplus._M_p[2] = '\0';
    local_338._M_dataplus._M_p[3] = '\0';
    local_338._M_dataplus._M_p[4] = '\0';
    local_338._M_dataplus._M_p[5] = '\0';
    local_338._M_dataplus._M_p[6] = '\0';
    local_338._M_dataplus._M_p[7] = '\0';
    *(pointer *)(local_338._M_dataplus._M_p + 8) = local_338._M_dataplus._M_p + 0x18;
    local_338._M_dataplus._M_p[0x10] = '\0';
    local_338._M_dataplus._M_p[0x11] = '\0';
    local_338._M_dataplus._M_p[0x12] = '\0';
    local_338._M_dataplus._M_p[0x13] = '\0';
    local_338._M_dataplus._M_p[0x14] = '\0';
    local_338._M_dataplus._M_p[0x15] = '\0';
    local_338._M_dataplus._M_p[0x16] = '\0';
    local_338._M_dataplus._M_p[0x17] = '\0';
    local_338._M_dataplus._M_p[0x18] = '\0';
    local_338._M_dataplus._M_p[0x28] = '\0';
    local_338._M_dataplus._M_p[0x29] = '\0';
    local_338._M_dataplus._M_p[0x2a] = '\0';
    local_338._M_dataplus._M_p[0x2b] = '\0';
    local_338._M_dataplus._M_p[0x2c] = '\0';
    local_338._M_dataplus._M_p[0x2d] = '\0';
    local_338._M_dataplus._M_p[0x2e] = '\0';
    local_338._M_dataplus._M_p[0x2f] = '\0';
    local_338._M_dataplus._M_p[0x30] = '\0';
    local_338._M_dataplus._M_p[0x31] = '\0';
    local_338._M_dataplus._M_p[0x32] = '\0';
    local_338._M_dataplus._M_p[0x33] = '\0';
    local_338._M_dataplus._M_p[0x34] = '\0';
    local_338._M_dataplus._M_p[0x35] = '\0';
    local_338._M_dataplus._M_p[0x36] = '\0';
    local_338._M_dataplus._M_p[0x37] = '\0';
    local_338._M_dataplus._M_p[0x38] = '\0';
    local_338._M_dataplus._M_p[0x39] = '\0';
    local_338._M_dataplus._M_p[0x3a] = '\0';
    local_338._M_dataplus._M_p[0x3b] = '\0';
    local_338._M_dataplus._M_p[0x3c] = '\0';
    local_338._M_dataplus._M_p[0x3d] = '\0';
    local_338._M_dataplus._M_p[0x3e] = '\0';
    local_338._M_dataplus._M_p[0x3f] = '\0';
    local_338._M_dataplus._M_p[0x40] = '\0';
    local_338._M_dataplus._M_p[0x41] = '\0';
    local_338._M_dataplus._M_p[0x42] = '\0';
    local_338._M_dataplus._M_p[0x43] = '\0';
    local_338._M_dataplus._M_p[0x44] = '\0';
    local_338._M_dataplus._M_p[0x45] = '\0';
    local_338._M_dataplus._M_p[0x46] = '\0';
    local_338._M_dataplus._M_p[0x47] = '\0';
    *(pointer *)(local_338._M_dataplus._M_p + 0x48) = local_338._M_dataplus._M_p + 0x60;
    *(pointer *)(local_338._M_dataplus._M_p + 0x50) = local_338._M_dataplus._M_p + 0x60;
    *(pointer *)(local_338._M_dataplus._M_p + 0x58) = local_338._M_dataplus._M_p + 0x80;
    local_338._M_dataplus._M_p[0x80] = '\0';
    local_338._M_dataplus._M_p[0x81] = '\0';
    local_338._M_dataplus._M_p[0x82] = '\0';
    local_338._M_dataplus._M_p[0x83] = '\0';
    local_338._M_dataplus._M_p[0x84] = '\0';
    local_338._M_dataplus._M_p[0x85] = '\0';
    local_338._M_dataplus._M_p[0x86] = '\0';
    local_338._M_dataplus._M_p[0x87] = '\0';
    local_338._M_dataplus._M_p[0x88] = '\0';
    local_338._M_dataplus._M_p[0x89] = '\0';
    local_338._M_dataplus._M_p[0x8a] = '\0';
    local_338._M_dataplus._M_p[0x8b] = '\0';
    local_338._M_dataplus._M_p[0x8c] = '\0';
    local_338._M_dataplus._M_p[0x8d] = '\0';
    local_338._M_dataplus._M_p[0x8e] = '\0';
    local_338._M_dataplus._M_p[0x8f] = '\0';
    local_338._M_dataplus._M_p[0x90] = '\0';
    local_338._M_dataplus._M_p[0x91] = '\0';
    local_338._M_dataplus._M_p[0x92] = '\0';
    local_338._M_dataplus._M_p[0x93] = '\0';
    local_338._M_dataplus._M_p[0x94] = '\0';
    local_338._M_dataplus._M_p[0x95] = '\0';
    local_338._M_dataplus._M_p[0x96] = '\0';
    local_338._M_dataplus._M_p[0x97] = '\0';
    *(code **)(local_338._M_dataplus._M_p + 0xa0) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:539:29)>
         ::_M_invoke;
    *(code **)(local_338._M_dataplus._M_p + 0x98) =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:539:29)>
         ::_M_manager;
    local_338._M_dataplus._M_p[0xc0] = '\x01';
    local_338._M_dataplus._M_p[200] = '\0';
    local_338._M_dataplus._M_p[0xc9] = '\0';
    local_338._M_dataplus._M_p[0xca] = '\0';
    local_338._M_dataplus._M_p[0xcb] = '\0';
    local_338._M_dataplus._M_p[0xcc] = '\0';
    local_338._M_dataplus._M_p[0xcd] = '\0';
    local_338._M_dataplus._M_p[0xce] = '\0';
    local_338._M_dataplus._M_p[0xcf] = '\0';
    local_338._M_dataplus._M_p[0xd0] = '\0';
    local_338._M_dataplus._M_p[0xd1] = '\0';
    local_338._M_dataplus._M_p[0xd2] = '\0';
    local_338._M_dataplus._M_p[0xd3] = '\0';
    local_338._M_dataplus._M_p[0xd4] = '\0';
    local_338._M_dataplus._M_p[0xd5] = '\0';
    local_338._M_dataplus._M_p[0xd6] = '\0';
    local_338._M_dataplus._M_p[0xd7] = '\0';
    std::
    vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
    ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
              ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
                *)FVar2._graph,(unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
    std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
              ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
    pNVar1 = ((FVar2._graph)->
             super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ).
             super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
             super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
             super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"left-",&local_341);
    std::__cxx11::to_string(&local_2d0,__val);
    std::operator+(&local_338,&local_2b0,&local_2d0);
    std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
    left._node = pNVar1;
    std::__cxx11::string::~string((string *)&local_338);
    std::__cxx11::string::~string((string *)&local_2d0);
    std::__cxx11::string::~string((string *)&local_2b0);
    uVar3 = rand();
    tasks_1 = &right;
    tasks = &left;
    if ((uVar3 & 1) == 0) {
      tasks_1 = &left;
      tasks = &right;
    }
    tf::Task::precede<tf::Task&,tf::Task&>(&parent,tasks,tasks_1);
    parent = (Task)left._node;
  }
  pcVar4 = (pointer)operator_new(0xd8);
  pcVar4[0] = '\0';
  pcVar4[1] = '\0';
  pcVar4[2] = '\0';
  pcVar4[3] = '\0';
  pcVar4[4] = '\0';
  pcVar4[5] = '\0';
  pcVar4[6] = '\0';
  pcVar4[7] = '\0';
  *(pointer *)(pcVar4 + 8) = pcVar4 + 0x18;
  pcVar4[0x10] = '\0';
  pcVar4[0x11] = '\0';
  pcVar4[0x12] = '\0';
  pcVar4[0x13] = '\0';
  pcVar4[0x14] = '\0';
  pcVar4[0x15] = '\0';
  pcVar4[0x16] = '\0';
  pcVar4[0x17] = '\0';
  pcVar4[0x18] = '\0';
  pcVar4[0x28] = '\0';
  pcVar4[0x29] = '\0';
  pcVar4[0x2a] = '\0';
  pcVar4[0x2b] = '\0';
  pcVar4[0x2c] = '\0';
  pcVar4[0x2d] = '\0';
  pcVar4[0x2e] = '\0';
  pcVar4[0x2f] = '\0';
  pcVar4[0x30] = '\0';
  pcVar4[0x31] = '\0';
  pcVar4[0x32] = '\0';
  pcVar4[0x33] = '\0';
  pcVar4[0x34] = '\0';
  pcVar4[0x35] = '\0';
  pcVar4[0x36] = '\0';
  pcVar4[0x37] = '\0';
  pcVar4[0x38] = '\0';
  pcVar4[0x39] = '\0';
  pcVar4[0x3a] = '\0';
  pcVar4[0x3b] = '\0';
  pcVar4[0x3c] = '\0';
  pcVar4[0x3d] = '\0';
  pcVar4[0x3e] = '\0';
  pcVar4[0x3f] = '\0';
  pcVar4[0x40] = '\0';
  pcVar4[0x41] = '\0';
  pcVar4[0x42] = '\0';
  pcVar4[0x43] = '\0';
  pcVar4[0x44] = '\0';
  pcVar4[0x45] = '\0';
  pcVar4[0x46] = '\0';
  pcVar4[0x47] = '\0';
  *(pointer *)(pcVar4 + 0x48) = pcVar4 + 0x60;
  *(pointer *)(pcVar4 + 0x50) = pcVar4 + 0x60;
  *(pointer *)(pcVar4 + 0x58) = pcVar4 + 0x80;
  pcVar4[0x80] = '\0';
  pcVar4[0x81] = '\0';
  pcVar4[0x82] = '\0';
  pcVar4[0x83] = '\0';
  pcVar4[0x84] = '\0';
  pcVar4[0x85] = '\0';
  pcVar4[0x86] = '\0';
  pcVar4[0x87] = '\0';
  pcVar4[0x88] = '\0';
  pcVar4[0x89] = '\0';
  pcVar4[0x8a] = '\0';
  pcVar4[0x8b] = '\0';
  pcVar4[0x8c] = '\0';
  pcVar4[0x8d] = '\0';
  pcVar4[0x8e] = '\0';
  pcVar4[0x8f] = '\0';
  pcVar4[0x90] = '\0';
  pcVar4[0x91] = '\0';
  pcVar4[0x92] = '\0';
  pcVar4[0x93] = '\0';
  pcVar4[0x94] = '\0';
  pcVar4[0x95] = '\0';
  pcVar4[0x96] = '\0';
  pcVar4[0x97] = '\0';
  pcVar4[0x98] = '\0';
  pcVar4[0x99] = '\0';
  pcVar4[0x9a] = '\0';
  pcVar4[0x9b] = '\0';
  pcVar4[0x9c] = '\0';
  pcVar4[0x9d] = '\0';
  pcVar4[0x9e] = '\0';
  pcVar4[0x9f] = '\0';
  pcVar4[0xa0] = '\0';
  pcVar4[0xa1] = '\0';
  pcVar4[0xa2] = '\0';
  pcVar4[0xa3] = '\0';
  pcVar4[0xa4] = '\0';
  pcVar4[0xa5] = '\0';
  pcVar4[0xa6] = '\0';
  pcVar4[0xa7] = '\0';
  plVar5 = (long *)operator_new(0x20);
  *plVar5 = (long)&count;
  plVar5[1] = (long)&W_local;
  plVar5[2] = (long)&stop;
  plVar5[3] = (long)&set;
  *(long **)(pcVar4 + 0x88) = plVar5;
  *(code **)(pcVar4 + 0xa0) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:554:27)>
       ::_M_invoke;
  *(code **)(pcVar4 + 0x98) =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/taskflow[P]taskflow/unittests/test_work_stealing.cpp:554:27)>
       ::_M_manager;
  pcVar4[0xc0] = '\x01';
  pcVar4[200] = '\0';
  pcVar4[0xc9] = '\0';
  pcVar4[0xca] = '\0';
  pcVar4[0xcb] = '\0';
  pcVar4[0xcc] = '\0';
  pcVar4[0xcd] = '\0';
  pcVar4[0xce] = '\0';
  pcVar4[0xcf] = '\0';
  pcVar4[0xd0] = '\0';
  pcVar4[0xd1] = '\0';
  pcVar4[0xd2] = '\0';
  pcVar4[0xd3] = '\0';
  pcVar4[0xd4] = '\0';
  pcVar4[0xd5] = '\0';
  pcVar4[0xd6] = '\0';
  pcVar4[0xd7] = '\0';
  local_338._M_dataplus._M_p = pcVar4;
  std::
  vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
  ::emplace_back<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>
            ((vector<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>,std::allocator<std::unique_ptr<tf::Node,std::default_delete<tf::Node>>>>
              *)taskflow.super_FlowBuilder._graph,
             (unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
  std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>::~unique_ptr
            ((unique_ptr<tf::Node,_std::default_delete<tf::Node>_> *)&local_338);
  pNVar1 = ((taskflow.super_FlowBuilder._graph)->
           super_vector<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ).
           super__Vector_base<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>,_std::allocator<std::unique_ptr<tf::Node,_std::default_delete<tf::Node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
           super___uniq_ptr_impl<tf::Node,_std::default_delete<tf::Node>_>._M_t.
           super__Tuple_impl<0UL,_tf::Node_*,_std::default_delete<tf::Node>_>.
           super__Head_base<0UL,_tf::Node_*,_false>._M_head_impl;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_338,"stop",(allocator<char> *)&local_2b0);
  std::__cxx11::string::_M_assign((string *)&pNVar1->_name);
  left._node = pNVar1;
  std::__cxx11::string::~string((string *)&local_338);
  tf::Node::_precede(parent._node,left._node);
  this = &executor;
  tf::Executor::run_n((Future<void> *)&local_338,this,&taskflow,0x400);
  std::__basic_future<void>::wait((__basic_future<void> *)&local_338,this);
  tf::Future<void>::~Future((Future<void> *)&local_338);
  std::
  _Hashtable<int,_int,_std::allocator<int>,_std::__detail::_Identity,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&set._M_h);
  tf::Executor::~Executor(&executor);
  tf::Taskflow::~Taskflow(&taskflow);
  return;
}

Assistant:

void skewed_starvation(size_t W) {
  
  tf::Taskflow taskflow;
  tf::Executor executor(W);

  std::atomic<size_t> stop, count;
  
  // all worker must be involved
  std::mutex mutex;
  std::unordered_set<int> set;

  tf::Task parent = taskflow.emplace([&](){ 
    set.clear();
    count.store(0, std::memory_order_relaxed);
    stop.store(false, std::memory_order_relaxed);
  }).name("root");

  tf::Task left, right;

  for(size_t w=0; w<W; w++) {
    right = taskflow.emplace([&, w](){
      if(w) {
        // record the worker
        {
          std::scoped_lock lock(mutex);
          set.insert(executor.this_worker_id());
        }

        count.fetch_add(1, std::memory_order_release);

        // block the worker
        while(stop.load(std::memory_order_relaxed) == false) {
          std::this_thread::yield();
        }
      }
    }).name(std::string("right-") + std::to_string(w));

    left = taskflow.emplace([&](){
      std::this_thread::yield();
    }).name(std::string("left-") + std::to_string(w));
    
    // we want to remove the effect of parent stealing
    if(rand() & 1) {
      parent.precede(left, right);
    }
    else {
      parent.precede(right, left);
    }

    parent = left;
  }

  left = taskflow.emplace([&](){
    // wait for the other W-1 workers to block
    while(count.load(std::memory_order_acquire) + 1 != W) {
      std::this_thread::yield();
    }
    stop.store(true, std::memory_order_relaxed);

    REQUIRE(set.size() + 1 == W);
  }).name("stop");

  parent.precede(left);

  //taskflow.dump(std::cout);

  executor.run_n(taskflow, 1024).wait();
}